

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,char_const*>,void>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>
          *alloc_ref)

{
  bool bVar1;
  size_t new_capacity;
  size_t sVar2;
  void *pvVar3;
  ctrl_t *pcVar4;
  ulong local_40;
  size_t i;
  ctrl_t *old_ctrl_ptr;
  slot_type *old_slots_ptr;
  slot_type *new_slots;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>
  *alloc_ref_local;
  CommonFields *c_local;
  HashSetResizeHelper *this_local;
  
  if (7 < this->old_capacity_) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const char *>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, const char *>>]"
                 );
  }
  sVar2 = this->old_capacity_;
  new_capacity = CommonFields::capacity(c);
  bVar1 = IsGrowingIntoSingleGroupApplicable(sVar2,new_capacity);
  if (bVar1) {
    sVar2 = CommonFields::capacity(c);
    bVar1 = is_single_group(sVar2);
    if (bVar1) {
      old_slots_ptr = (slot_type *)CommonFields::slot_array(c);
      pvVar3 = old_slots(this);
      pcVar4 = old_ctrl(this);
      for (local_40 = 0; old_slots_ptr = old_slots_ptr + 1, local_40 < this->old_capacity_;
          local_40 = local_40 + 1) {
        bVar1 = IsFull(pcVar4[local_40]);
        if (bVar1) {
          SanitizerUnpoisonMemoryRegion(old_slots_ptr,0x28);
          common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,char_const*>,void>
          ::transfer<std::allocator<std::pair<std::__cxx11::string_const,char_const*>>>
                    (alloc_ref,old_slots_ptr,(slot_type *)((long)pvVar3 + local_40 * 0x28));
        }
      }
      PoisonSingleGroupEmptySlots(this,c,0x28);
      return;
    }
    __assert_fail("(is_single_group(c.capacity())) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x85a,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const char *>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, const char *>>]"
                 );
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const char *>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, const char *>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }